

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Net.cpp
# Opt level: O1

void __thiscall CNet::AddPin(CNet *this,vector<CPin_*,_std::allocator<CPin_*>_> *pPinList)

{
  int *piVar1;
  short sVar2;
  uint uVar3;
  ulong uVar4;
  CPin **ppCVar5;
  pointer ppCVar6;
  ulong uVar7;
  
  uVar4 = (long)(pPinList->super__Vector_base<CPin_*,_std::allocator<CPin_*>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pPinList->super__Vector_base<CPin_*,_std::allocator<CPin_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar4 != 0) {
    uVar7 = 0xffffffffffffffff;
    if (-1 < (long)uVar4) {
      uVar7 = uVar4;
    }
    ppCVar5 = (CPin **)operator_new__(uVar7);
    this->m_ppPin = ppCVar5;
    ppCVar6 = (pPinList->super__Vector_base<CPin_*,_std::allocator<CPin_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((pPinList->super__Vector_base<CPin_*,_std::allocator<CPin_*>_>)._M_impl.
        super__Vector_impl_data._M_finish == ppCVar6) {
      sVar2 = 0;
    }
    else {
      uVar4 = 0;
      sVar2 = 0;
      do {
        this->m_ppPin[uVar4] = ppCVar6[uVar4];
        sVar2 = sVar2 + 1;
        uVar4 = (ulong)sVar2;
        ppCVar6 = (pPinList->super__Vector_base<CPin_*,_std::allocator<CPin_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      } while (uVar4 < (ulong)((long)(pPinList->super__Vector_base<CPin_*,_std::allocator<CPin_*>_>)
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar6 >> 3
                              ));
    }
    this->m_iNumPin = sVar2;
  }
  if ((ushort)this->m_iNumPin < 2) {
    piVar1 = &(this->super_CObject).m_iProp;
    *(byte *)piVar1 = (byte)*piVar1 | 1;
  }
  else {
    if (this->m_iNumPin == 2) {
      uVar3 = (this->super_CObject).m_iProp & 0xfffffffcU | 2;
    }
    else {
      uVar3 = (this->super_CObject).m_iProp & 0xfffffff8U | 4;
    }
    (this->super_CObject).m_iProp = uVar3;
  }
  return;
}

Assistant:

void CNet::AddPin(vector<CPin*>* pPinList)
{
	if(pPinList->size())
	{
		m_ppPin	=	new	CPin*[pPinList->size()];
		for(m_iNumPin=0;m_iNumPin<pPinList->size();m_iNumPin++)	m_ppPin[m_iNumPin]	=	(*pPinList)[m_iNumPin];
	}

	switch(GetNumPin()){
	case 0:
	case 1:
		m_iProp	|=	PROP_NET_LOCAL;
		break;
	case 2:
		m_iProp	&=	~PROP_NET_LOCAL;
		m_iProp	|=	PROP_NET_TWOPIN;
		break;
	default:
		m_iProp	&=	~(PROP_NET_LOCAL|PROP_NET_TWOPIN);
		m_iProp	|=	PROP_NET_GLOBAL;
		break;
	}
}